

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O0

void duckdb::FixedSizeScanPartial<signed_char>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  idx_t iVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  data_ptr_t pdVar4;
  Vector *in_RCX;
  size_t in_RDX;
  long in_RSI;
  ColumnSegment *in_RDI;
  long in_R8;
  data_ptr_t source_data;
  data_ptr_t data;
  idx_t start;
  FixedSizeScanState *scan_state;
  SegmentScanState *in_stack_ffffffffffffffb0;
  
  unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
  operator->((unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
              *)in_stack_ffffffffffffffb0);
  SegmentScanState::Cast<duckdb::FixedSizeScanState>(in_stack_ffffffffffffffb0);
  iVar1 = ColumnSegment::GetRelativeIndex(in_RDI,*(idx_t *)(in_RSI + 0x10));
  pdVar2 = BufferHandle::Ptr((BufferHandle *)0xa3e2ae);
  iVar3 = ColumnSegment::GetBlockOffset(in_RDI);
  Vector::SetVectorType(in_RCX,(VectorType)((ulong)in_R8 >> 0x38));
  pdVar4 = FlatVector::GetData((Vector *)0xa3e2f9);
  memcpy(pdVar4 + in_R8,pdVar2 + iVar1 + iVar3,in_RDX);
  return;
}

Assistant:

void FixedSizeScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                          idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<FixedSizeScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto source_data = data + start * sizeof(T);

	// copy the data from the base table
	result.SetVectorType(VectorType::FLAT_VECTOR);
	memcpy(FlatVector::GetData(result) + result_offset * sizeof(T), source_data, scan_count * sizeof(T));
}